

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

bool __thiscall
Clasp::ClaspVmtf::bump(ClaspVmtf *this,Solver *param_2,WeightLitVec *lits,double adj)

{
  int iVar1;
  Var n;
  const_iterator ppVar2;
  reference this_00;
  uint32 *puVar3;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  const_iterator end;
  const_iterator it;
  const_iterator local_28;
  
  local_28 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::begin(in_RDX);
  ppVar2 = bk_lib::
           pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
           ::end(in_RDX);
  for (; local_28 != ppVar2; local_28 = local_28 + 1) {
    iVar1 = local_28->second;
    n = Literal::var(&local_28->first);
    this_00 = bk_lib::
              pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>::
              operator[]((pod_vector<Clasp::ClaspVmtf::VarInfo,_std::allocator<Clasp::ClaspVmtf::VarInfo>_>
                          *)(in_RDI + 8),n);
    puVar3 = VarInfo::activity(this_00,*(uint32 *)(in_RDI + 0x2c));
    *puVar3 = (int)(long)((double)iVar1 * in_XMM0_Qa) + *puVar3;
  }
  return true;
}

Assistant:

bool ClaspVmtf::bump(const Solver&, const WeightLitVec& lits, double adj) {
	for (WeightLitVec::const_iterator it = lits.begin(), end = lits.end(); it != end; ++it) {
		score_[it->first.var()].activity(decay_) += static_cast<uint32>(it->second*adj);
	}
	return true;
}